

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

bool tinyusdz::tydra::ShaderToPrimSpec(UsdTransform2d *node,PrimSpec *ps,string *warn,string *err)

{
  Specifier SVar1;
  bool bVar2;
  ostream *poVar3;
  value_type *pvVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *this;
  reference ppVar5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *pmVar6;
  mapped_type *pmVar7;
  PrimMeta *pPVar8;
  PrimMeta *this_00;
  string *this_01;
  Specifier *pSVar9;
  TypedTerminalAttribute<std::array<float,_2UL>_> *input;
  allocator local_3ab1;
  key_type local_3ab0;
  Token local_3a90;
  Attribute local_3a70;
  Property local_37c8;
  undefined1 local_31e8 [8];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>
  prop_4;
  const_iterator __end2;
  const_iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *__range2;
  key_type local_2bc8;
  optional<tinyusdz::Property> local_2ba8;
  undefined1 local_25c0 [8];
  optional<tinyusdz::Property> pv;
  key_type local_1fd0;
  string local_1fb0 [39];
  allocator local_1f89;
  string local_1f88;
  string local_1f68;
  ostringstream local_1f48 [8];
  ostringstream ss_e_3;
  undefined1 local_1dd0 [8];
  Property prop_3;
  key_type local_17e8;
  string local_17c8 [39];
  allocator local_17a1;
  string local_17a0;
  string local_1780;
  ostringstream local_1760 [8];
  ostringstream ss_e_2;
  undefined1 local_15e8 [8];
  Property prop_2;
  key_type local_1000;
  string local_fe0 [39];
  allocator local_fb9;
  string local_fb8;
  string local_f98;
  ostringstream local_f78 [8];
  ostringstream ss_e_1;
  undefined1 local_e00 [8];
  Property prop_1;
  key_type local_818;
  int local_7f4;
  string local_7f0 [39];
  allocator local_7c9;
  string local_7c8;
  string local_7a8;
  ostringstream local_788 [8];
  ostringstream ss_e;
  undefined1 local_610 [8];
  Property prop;
  string *err_local;
  string *warn_local;
  PrimSpec *ps_local;
  UsdTransform2d *node_local;
  
  prop._1496_8_ = err;
  Property::Property((Property *)local_610);
  bVar2 = (anonymous_namespace)::ToProperty<std::array<float,2ul>>
                    (&node->in,(Property *)local_610,(string *)prop._1496_8_);
  if (bVar2) {
    pmVar6 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
              *)PrimSpec::props_abi_cxx11_(ps);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_818,"inputs:in",(allocator *)&prop_1.field_0x5df);
    pmVar7 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
             ::operator[](pmVar6,&local_818);
    Property::operator=(pmVar7,(Property *)local_610);
    ::std::__cxx11::string::~string((string *)&local_818);
    ::std::allocator<char>::~allocator((allocator<char> *)&prop_1.field_0x5df);
    local_7f4 = 0;
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_788);
    poVar3 = ::std::operator<<((ostream *)local_788,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"ShaderToPrimSpec");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x903);
    ::std::operator<<(poVar3," ");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_7c8,"Convert {} to Property failed.\n",&local_7c9);
    fmt::format<char[10]>(&local_7a8,&local_7c8,(char (*) [10])"inputs:in");
    poVar3 = ::std::operator<<((ostream *)local_788,(string *)&local_7a8);
    ::std::operator<<(poVar3,"\n");
    ::std::__cxx11::string::~string((string *)&local_7a8);
    ::std::__cxx11::string::~string((string *)&local_7c8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_7c9);
    if (prop._1496_8_ != 0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)prop._1496_8_,local_7f0);
      ::std::__cxx11::string::~string(local_7f0);
    }
    node_local._7_1_ = 0;
    local_7f4 = 1;
    ::std::__cxx11::ostringstream::~ostringstream(local_788);
  }
  Property::~Property((Property *)local_610);
  if (local_7f4 == 0) {
    Property::Property((Property *)local_e00);
    bVar2 = anon_unknown_6::ToProperty<float>
                      (&node->rotation,(Property *)local_e00,(string *)prop._1496_8_);
    if (bVar2) {
      pmVar6 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                *)PrimSpec::props_abi_cxx11_(ps);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_1000,"inputs:rotation",(allocator *)&prop_2.field_0x5df);
      pmVar7 = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               ::operator[](pmVar6,&local_1000);
      Property::operator=(pmVar7,(Property *)local_e00);
      ::std::__cxx11::string::~string((string *)&local_1000);
      ::std::allocator<char>::~allocator((allocator<char> *)&prop_2.field_0x5df);
      local_7f4 = 0;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_f78);
      poVar3 = ::std::operator<<((ostream *)local_f78,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"ShaderToPrimSpec");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x904);
      ::std::operator<<(poVar3," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_fb8,"Convert {} to Property failed.\n",&local_fb9);
      fmt::format<char[16]>(&local_f98,&local_fb8,(char (*) [16])"inputs:rotation");
      poVar3 = ::std::operator<<((ostream *)local_f78,(string *)&local_f98);
      ::std::operator<<(poVar3,"\n");
      ::std::__cxx11::string::~string((string *)&local_f98);
      ::std::__cxx11::string::~string((string *)&local_fb8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fb9);
      if (prop._1496_8_ != 0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=((string *)prop._1496_8_,local_fe0);
        ::std::__cxx11::string::~string(local_fe0);
      }
      node_local._7_1_ = 0;
      local_7f4 = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_f78);
    }
    Property::~Property((Property *)local_e00);
    if (local_7f4 == 0) {
      Property::Property((Property *)local_15e8);
      bVar2 = (anonymous_namespace)::ToProperty<std::array<float,2ul>>
                        (&node->scale,(Property *)local_15e8,(string *)prop._1496_8_);
      if (bVar2) {
        pmVar6 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                  *)PrimSpec::props_abi_cxx11_(ps);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_17e8,"inputs:scale",(allocator *)&prop_3.field_0x5df);
        pmVar7 = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                 ::operator[](pmVar6,&local_17e8);
        Property::operator=(pmVar7,(Property *)local_15e8);
        ::std::__cxx11::string::~string((string *)&local_17e8);
        ::std::allocator<char>::~allocator((allocator<char> *)&prop_3.field_0x5df);
        local_7f4 = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_1760);
        poVar3 = ::std::operator<<((ostream *)local_1760,"[error]");
        poVar3 = ::std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                  );
        poVar3 = ::std::operator<<(poVar3,":");
        poVar3 = ::std::operator<<(poVar3,"ShaderToPrimSpec");
        poVar3 = ::std::operator<<(poVar3,"():");
        poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x905);
        ::std::operator<<(poVar3," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_17a0,"Convert {} to Property failed.\n",&local_17a1);
        fmt::format<char[13]>(&local_1780,&local_17a0,(char (*) [13])"inputs:scale");
        poVar3 = ::std::operator<<((ostream *)local_1760,(string *)&local_1780);
        ::std::operator<<(poVar3,"\n");
        ::std::__cxx11::string::~string((string *)&local_1780);
        ::std::__cxx11::string::~string((string *)&local_17a0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_17a1);
        if (prop._1496_8_ != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::__cxx11::string::operator+=((string *)prop._1496_8_,local_17c8);
          ::std::__cxx11::string::~string(local_17c8);
        }
        node_local._7_1_ = 0;
        local_7f4 = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_1760);
      }
      Property::~Property((Property *)local_15e8);
      if (local_7f4 == 0) {
        Property::Property((Property *)local_1dd0);
        bVar2 = (anonymous_namespace)::ToProperty<std::array<float,2ul>>
                          (&node->translation,(Property *)local_1dd0,(string *)prop._1496_8_);
        if (bVar2) {
          pmVar6 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                    *)PrimSpec::props_abi_cxx11_(ps);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&local_1fd0,"inputs:translation",
                     (allocator *)((long)&pv.contained + 0x5df));
          pmVar7 = ::std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                   ::operator[](pmVar6,&local_1fd0);
          Property::operator=(pmVar7,(Property *)local_1dd0);
          ::std::__cxx11::string::~string((string *)&local_1fd0);
          ::std::allocator<char>::~allocator((allocator<char> *)((long)&pv.contained + 0x5df));
          local_7f4 = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_1f48);
          poVar3 = ::std::operator<<((ostream *)local_1f48,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ShaderToPrimSpec");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x906);
          ::std::operator<<(poVar3," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&local_1f88,"Convert {} to Property failed.\n",&local_1f89);
          fmt::format<char[19]>(&local_1f68,&local_1f88,(char (*) [19])"inputs:translation");
          poVar3 = ::std::operator<<((ostream *)local_1f48,(string *)&local_1f68);
          ::std::operator<<(poVar3,"\n");
          ::std::__cxx11::string::~string((string *)&local_1f68);
          ::std::__cxx11::string::~string((string *)&local_1f88);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1f89);
          if (prop._1496_8_ != 0) {
            ::std::__cxx11::ostringstream::str();
            ::std::__cxx11::string::operator+=((string *)prop._1496_8_,local_1fb0);
            ::std::__cxx11::string::~string(local_1fb0);
          }
          node_local._7_1_ = 0;
          local_7f4 = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_1f48);
        }
        Property::~Property((Property *)local_1dd0);
        if (local_7f4 == 0) {
          (anonymous_namespace)::TypedTerminalAttributeToProperty<std::array<float,2ul>>
                    (&local_2ba8,(_anonymous_namespace_ *)&node->result,input);
          nonstd::optional_lite::optional<tinyusdz::Property>::optional<tinyusdz::Property,_0>
                    ((optional<tinyusdz::Property> *)local_25c0,&local_2ba8);
          nonstd::optional_lite::optional<tinyusdz::Property>::~optional(&local_2ba8);
          bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_25c0);
          if (bVar2) {
            pvVar4 = nonstd::optional_lite::optional<tinyusdz::Property>::value
                               ((optional<tinyusdz::Property> *)local_25c0);
            pmVar6 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)PrimSpec::props_abi_cxx11_(ps);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_2bc8,"outputs:result",(allocator *)((long)&__range2 + 7));
            pmVar7 = ::std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                     ::operator[](pmVar6,&local_2bc8);
            Property::operator=(pmVar7,pvVar4);
            ::std::__cxx11::string::~string((string *)&local_2bc8);
            ::std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
          }
          nonstd::optional_lite::optional<tinyusdz::Property>::~optional
                    ((optional<tinyusdz::Property> *)local_25c0);
          this = &(node->super_ShaderNode).super_UsdShadePrim.props;
          __end2 = ::std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                   ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                            *)this);
          prop_4.second._1496_8_ =
               ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)this);
          while (bVar2 = ::std::operator!=(&__end2,(_Self *)&prop_4.second._has_custom), bVar2) {
            ppVar5 = ::std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
                     ::operator*(&__end2);
            ::std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>
            ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>
                    *)local_31e8,ppVar5);
            pmVar6 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)PrimSpec::props_abi_cxx11_(ps);
            pmVar7 = ::std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                     ::operator[](pmVar6,(key_type *)local_31e8);
            Property::operator=(pmVar7,(Property *)((long)&prop_4.first.field_2 + 8));
            ::std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>
            ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>
                     *)local_31e8);
            ::std::
            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
            ::operator++(&__end2);
          }
          Token::Token(&local_3a90,"UsdTransform2d");
          Attribute::Uniform<tinyusdz::Token>(&local_3a70,&local_3a90);
          Property::Property(&local_37c8,&local_3a70,false);
          pmVar6 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                    *)PrimSpec::props_abi_cxx11_(ps);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_3ab0,"info:id",&local_3ab1);
          pmVar7 = ::std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                   ::operator[](pmVar6,&local_3ab0);
          Property::operator=(pmVar7,&local_37c8);
          ::std::__cxx11::string::~string((string *)&local_3ab0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_3ab1);
          Property::~Property(&local_37c8);
          Attribute::~Attribute(&local_3a70);
          Token::~Token(&local_3a90);
          pPVar8 = UsdShadePrim::metas((UsdShadePrim *)node);
          this_00 = PrimSpec::metas(ps);
          PrimMetas::operator=(this_00,pPVar8);
          this_01 = PrimSpec::name_abi_cxx11_(ps);
          ::std::__cxx11::string::operator=((string *)this_01,(string *)node);
          SVar1 = (node->super_ShaderNode).super_UsdShadePrim.spec;
          pSVar9 = PrimSpec::specifier(ps);
          *pSVar9 = SVar1;
          node_local._7_1_ = 1;
        }
      }
    }
  }
  return (bool)(node_local._7_1_ & 1);
}

Assistant:

bool ShaderToPrimSpec(const UsdTransform2d &node, PrimSpec &ps,
                      std::string *warn, std::string *err) {
  (void)warn;

#define TO_PROPERTY(__prop_name, __v)                                    \
  {                                                                      \
    Property prop;                                                       \
    if (!ToProperty(__v, prop, err)) {                                   \
      PUSH_ERROR_AND_RETURN(                                             \
          fmt::format("Convert {} to Property failed.\n", __prop_name)); \
    }                                                                    \
    ps.props()[__prop_name] = prop;                                      \
  }

  // inputs
  TO_PROPERTY("inputs:in", node.in)
  TO_PROPERTY("inputs:rotation", node.rotation)
  TO_PROPERTY("inputs:scale", node.scale)
  TO_PROPERTY("inputs:translation", node.translation)

  // outputs
  if (auto pv = TypedTerminalAttributeToProperty(node.result)) {
    ps.props()["outputs:result"] = pv.value();
  }

  for (auto prop : node.props) {
    ps.props()[prop.first] = prop.second;
  }

  ps.props()[kInfoId] =
      Property(Attribute::Uniform(value::token(kUsdTransform2d)));
  ps.metas() = node.metas();
  ps.name() = node.name;
  ps.specifier() = node.spec;

  return true;
}